

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.h
# Opt level: O0

void crnlib::utils::write_obj<unsigned_short>
               (unsigned_short *obj,void *pBuf,bool buffer_is_little_endian)

{
  undefined4 local_34;
  uint i;
  uint8 *pDst;
  uint8 *pSrc;
  bool buffer_is_little_endian_local;
  void *pBuf_local;
  unsigned_short *obj_local;
  
  if (buffer_is_little_endian) {
    *(unsigned_short *)pBuf = *obj;
  }
  else {
    for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
      *(undefined1 *)((long)pBuf + (ulong)local_34) =
           *(undefined1 *)((long)obj + (1 - (ulong)local_34));
    }
  }
  return;
}

Assistant:

inline void write_obj(const T& obj, void* pBuf, bool buffer_is_little_endian)
        {
            const uint8* pSrc = reinterpret_cast<const uint8*>(&obj);
            uint8* pDst = static_cast<uint8*>(pBuf);

            if (c_crnlib_little_endian_platform == buffer_is_little_endian)
            {
                memcpy(pDst, pSrc, sizeof(T));
            }
            else
            {
                for (uint i = 0; i < sizeof(T); i++)
                {
                    pDst[i] = pSrc[sizeof(T) - 1 - i];
                }
            }
        }